

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::implied(SimpSolver *this,vec<Minisat::Lit,_int> *c)

{
  bool bVar1;
  int iVar2;
  Size SVar3;
  Lit p;
  CRef CVar4;
  Lit *pLVar5;
  bool result;
  lbool local_3a;
  uint8_t local_39;
  int local_38;
  lbool local_32;
  uint8_t local_31;
  int local_30;
  lbool local_29;
  int local_28;
  Size local_24;
  int i;
  vec<Minisat::Lit,_int> *c_local;
  SimpSolver *this_local;
  
  _i = c;
  c_local = (vec<Minisat::Lit,_int> *)this;
  iVar2 = Solver::decisionLevel(&this->super_Solver);
  if (iVar2 != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x142,"bool Minisat::SimpSolver::implied(const vec<Lit> &)");
  }
  local_24 = vec<Minisat::Lit,_int>::size(&(this->super_Solver).trail);
  vec<int,_int>::push(&(this->super_Solver).trail_lim,&local_24);
  local_28 = 0;
  while( true ) {
    iVar2 = local_28;
    SVar3 = vec<Minisat::Lit,_int>::size(_i);
    if (SVar3 <= iVar2) {
      CVar4 = Solver::propagate(&this->super_Solver);
      Solver::cancelUntil(&this->super_Solver,0);
      return CVar4 != 0xffffffff;
    }
    pLVar5 = vec<Minisat::Lit,_int>::operator[](_i,local_28);
    local_30 = pLVar5->x;
    local_29 = Solver::value(&this->super_Solver,(Lit)local_30);
    local_31 = l_True.value;
    bVar1 = lbool::operator==(&local_29,l_True);
    if (bVar1) break;
    pLVar5 = vec<Minisat::Lit,_int>::operator[](_i,local_28);
    local_38 = pLVar5->x;
    local_32 = Solver::value(&this->super_Solver,(Lit)local_38);
    local_39 = l_False.value;
    bVar1 = lbool::operator!=(&local_32,l_False);
    if (bVar1) {
      pLVar5 = vec<Minisat::Lit,_int>::operator[](_i,local_28);
      local_3a = Solver::value(&this->super_Solver,(Lit)pLVar5->x);
      bVar1 = lbool::operator==(&local_3a,l_Undef);
      if (!bVar1) {
        __assert_fail("value(c[i]) == l_Undef",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                      ,0x14a,"bool Minisat::SimpSolver::implied(const vec<Lit> &)");
      }
      pLVar5 = vec<Minisat::Lit,_int>::operator[](_i,local_28);
      p = operator~(pLVar5->x);
      Solver::uncheckedEnqueue(&this->super_Solver,p,0xffffffff);
    }
    local_28 = local_28 + 1;
  }
  Solver::cancelUntil(&this->super_Solver,0);
  return true;
}

Assistant:

bool SimpSolver::implied(const vec<Lit>& c)
{
    assert(decisionLevel() == 0);

    trail_lim.push(trail.size());
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True){
            cancelUntil(0);
            return true;
        }else if (value(c[i]) != l_False){
            assert(value(c[i]) == l_Undef);
            uncheckedEnqueue(~c[i]);
        }

    bool result = propagate() != CRef_Undef;
    cancelUntil(0);
    return result;
}